

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorldCoordinates.h
# Opt level: O3

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::positionReset
          (DeadReckoningCalculator *this,WorldCoordinates *Position)

{
  KFLOAT64 KVar1;
  
  (this->m_initPosition).m_f64Z = Position->m_f64Z;
  KVar1 = Position->m_f64Y;
  (this->m_initPosition).m_f64X = Position->m_f64X;
  (this->m_initPosition).m_f64Y = KVar1;
  return;
}

Assistant:

class KDIS_EXPORT WorldCoordinates : public DataTypeBase
{
protected:

    KFLOAT64 m_f64X;

    KFLOAT64 m_f64Y;

    KFLOAT64 m_f64Z;

public:

    static const KUINT16 WORLD_COORDINATES_SIZE = 24;

    WorldCoordinates();

    explicit WorldCoordinates(KDataStream &stream) noexcept(false);

    WorldCoordinates( KFLOAT64 X, KFLOAT64 Y, KFLOAT64 Z );

    ~WorldCoordinates() override = default;

    //************************************
    // FullName:    KDIS::DATA_TYPE::WorldCoordinates::SetX
    //              KDIS::DATA_TYPE::WorldCoordinates::GetX
    // Description: X
    // Parameter:   KFLOAT64 X
    //************************************
    void SetX( KFLOAT64 X );
    KFLOAT64 GetX() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::WorldCoordinates::SetY
    //              KDIS::DATA_TYPE::WorldCoordinates::GetY
    // Description: Y
    // Parameter:   KFLOAT64 Y
    //************************************
    void SetY( KFLOAT64 Y );
    KFLOAT64 GetY() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::WorldCoordinates::SetZ
    //              KDIS::DATA_TYPE::WorldCoordinates::GetZ
    // Description: Z
    // Parameter:   KFLOAT64 Z
    //************************************
    void SetZ( KFLOAT64 Z );
    KFLOAT64 GetZ() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::WorldCoordinates::Set
    // Description: Sets x,y and z.
    // Parameter:   KFLOAT64 X
    // Parameter:   KFLOAT64 Y
    // Parameter:   KFLOAT64 Z
    //************************************
    void Set( KFLOAT64 X, KFLOAT64 Y, KFLOAT64 Z );

    //************************************
    // FullName:    KDIS::DATA_TYPE::WorldCoordinates::GetDistance
    // Description: Calculates the distance from this WorldCoordinates to an other.
    //************************************
    KFLOAT64 GetDistance( const WorldCoordinates & Other );

    //************************************
    // FullName:    KDIS::DATA_TYPE::WorldCoordinates::Lerp
    // Description: Linearly interpolate between From and To by T.
    //              T should be between 0 and 1(its not checked).
    //              T 0 = From
    //              1 = to
    //              0.5 = halfway between From and To.
    // Parameter:   const WorldCoordinates & From
    // Parameter:   const WorldCoordinates & To
    // Parameter:   KFLOAT32 T
    //************************************
    static WorldCoordinates Lerp( const WorldCoordinates & From, const WorldCoordinates & To, KFLOAT32 T );
    void Lerp( const WorldCoordinates & To, KFLOAT32 T );

    //************************************
    // FullName:    KDIS::DATA_TYPE::WorldCoordinates::GetAsString
    // Description: Returns a string representation
    //************************************
    KString GetAsString() const override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::WorldCoordinates::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    void Decode(KDataStream &stream) noexcept(false) override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::WorldCoordinates::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    KDataStream Encode() const override;

    void Encode(KDataStream &stream) const override;

    KBOOL operator == ( const WorldCoordinates & Value ) const;
    KBOOL operator != ( const WorldCoordinates & Value ) const;
    WorldCoordinates operator * ( const WorldCoordinates & Value ) const;
    WorldCoordinates operator * ( KFLOAT64 Value ) const;
    WorldCoordinates operator * ( KFLOAT32 Value ) const;
    WorldCoordinates operator + ( const WorldCoordinates & Value ) const;
    WorldCoordinates operator + ( const Vector & Value ) const;
    WorldCoordinates & operator += ( const Vector & Value );

    WorldCoordinates &operator=(const Vector &Value);
    WorldCoordinates operator - ( const WorldCoordinates & Value ) const;
    WorldCoordinates & operator -= ( const WorldCoordinates & Value );

    // Valid values 0 - X, 1 - Y, 2 - Z. throws OUT_OF_BOUNDS exception for any other value.
    KFLOAT64 &operator[](KUINT16 i) noexcept(false);

    const KFLOAT64 &operator[](KUINT16 i) const noexcept(false);
}